

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O0

ptrlen ptrlen_get_word(ptrlen *input,char *separators)

{
  ptrlen pVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  size_t to_consume;
  char *end;
  char *p;
  char *separators_local;
  ptrlen *input_local;
  ptrlen toret;
  
  end = (char *)input->ptr;
  pcVar3 = end + input->len;
  while( true ) {
    pcVar2 = end;
    bVar6 = false;
    if (end < pcVar3) {
      pcVar4 = strchr(separators,(int)*end);
      bVar6 = pcVar4 != (char *)0x0;
    }
    if (!bVar6) break;
    end = end + 1;
  }
  while( true ) {
    bVar6 = false;
    if (end < pcVar3) {
      pcVar4 = strchr(separators,(int)*end);
      bVar6 = pcVar4 == (char *)0x0;
    }
    if (!bVar6) break;
    end = end + 1;
  }
  uVar5 = (long)end - (long)input->ptr;
  if (input->len < uVar5) {
    __assert_fail("to_consume <= input->len",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/ptrlen.c"
                  ,0x56,"ptrlen ptrlen_get_word(ptrlen *, const char *)");
  }
  input->ptr = (void *)((long)input->ptr + uVar5);
  input->len = input->len - uVar5;
  pVar1.len = (long)end - (long)pcVar2;
  pVar1.ptr = pcVar2;
  return pVar1;
}

Assistant:

ptrlen ptrlen_get_word(ptrlen *input, const char *separators)
{
    const char *p = input->ptr, *end = p + input->len;
    ptrlen toret;

    while (p < end && strchr(separators, *p))
        p++;
    toret.ptr = p;
    while (p < end && !strchr(separators, *p))
        p++;
    toret.len = p - (const char *)toret.ptr;

    size_t to_consume = p - (const char *)input->ptr;
    assert(to_consume <= input->len);
    input->ptr = (const char *)input->ptr + to_consume;
    input->len -= to_consume;

    return toret;
}